

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

void __thiscall
node::BlockManager::UpdateBlockInfo(BlockManager *this,CBlock *block,uint nHeight,FlatFilePos *pos)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  optional<node::BlockfileCursor> *poVar4;
  pointer pCVar5;
  uint uVar6;
  uint uVar8;
  long in_FS_OFFSET;
  int nFile;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  SizeComputer local_68;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_60;
  VectorFormatter<DefaultFormatter> local_49;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  _Storage<node::BlockfileCursor,_true> _Var7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_owns = false;
  local_48._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  bVar3 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value <= (int)nHeight &
          (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged;
  poVar4 = (this->m_blockfile_cursors)._M_elems + bVar3;
  if ((this->m_blockfile_cursors)._M_elems[bVar3].
      super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
      super__Optional_payload_base<node::BlockfileCursor>._M_engaged == true) {
    uVar6 = pos->nFile;
    if ((int)uVar6 <=
        (poVar4->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_payload._M_value.file_num)
    goto LAB_0020fe23;
  }
  else {
    uVar6 = pos->nFile;
    (this->m_blockfile_cursors)._M_elems[bVar3].
    super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
    super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
  }
  _Var7._M_value.undo_height = 0;
  _Var7._M_value.file_num = uVar6;
  (poVar4->super__Optional_base<node::BlockfileCursor,_true,_true>)._M_payload.
  super__Optional_payload_base<node::BlockfileCursor>._M_payload = _Var7;
LAB_0020fe23:
  local_60.m_params = &::TX_WITH_WITNESS;
  local_60.m_substream = &local_68;
  local_68.nSize = 0x50;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
            (&local_49,&local_60,&block->vtx);
  iVar2 = (int)local_68.nSize;
  iVar1 = pos->nFile;
  local_60.m_params = (TransactionSerParams *)CONCAT44(local_60.m_params._4_4_,iVar1);
  pCVar5 = (this->m_blockfile_info).
           super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->m_blockfile_info).
                          super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pCVar5) >> 3) *
      -0x33333333 <= iVar1) {
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
              (&this->m_blockfile_info,(long)iVar1 + 1);
    pCVar5 = (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  CBlockFileInfo::AddBlock(pCVar5 + iVar1,nHeight,(ulong)(block->super_CBlockHeader).nTime);
  uVar8 = iVar2 + pos->nPos;
  pCVar5 = (this->m_blockfile_info).
           super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = pCVar5[(int)local_60.m_params].nSize;
  if (uVar8 <= uVar6) {
    uVar8 = uVar6;
  }
  pCVar5[(int)local_60.m_params].nSize = uVar8;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->m_dirty_fileinfo,(int *)&local_60);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BlockManager::UpdateBlockInfo(const CBlock& block, unsigned int nHeight, const FlatFilePos& pos)
{
    LOCK(cs_LastBlockFile);

    // Update the cursor so it points to the last file.
    const BlockfileType chain_type{BlockfileTypeForHeight(nHeight)};
    auto& cursor{m_blockfile_cursors[chain_type]};
    if (!cursor || cursor->file_num < pos.nFile) {
        m_blockfile_cursors[chain_type] = BlockfileCursor{pos.nFile};
    }

    // Update the file information with the current block.
    const unsigned int added_size = ::GetSerializeSize(TX_WITH_WITNESS(block));
    const int nFile = pos.nFile;
    if (static_cast<int>(m_blockfile_info.size()) <= nFile) {
        m_blockfile_info.resize(nFile + 1);
    }
    m_blockfile_info[nFile].AddBlock(nHeight, block.GetBlockTime());
    m_blockfile_info[nFile].nSize = std::max(pos.nPos + added_size, m_blockfile_info[nFile].nSize);
    m_dirty_fileinfo.insert(nFile);
}